

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O1

int * inform_black_box_parts
                (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,int *box,
                inform_error *err)

{
  long *plVar1;
  size_t __size;
  long lVar2;
  _Bool _Var3;
  long *plVar4;
  int *__ptr;
  long lVar5;
  size_t sVar6;
  int *b_00;
  ulong uVar7;
  size_t sVar8;
  int *__dest;
  int iVar9;
  bool bVar10;
  
  _Var3 = check_arguments(series,l,1,n,b,(size_t *)0x0,(size_t *)0x0,err);
  if (_Var3) {
    return (int *)0x0;
  }
  if (parts != (size_t *)0x0 && nparts != 0) {
    __size = l * 8;
    plVar4 = (long *)malloc(__size);
    memcpy(plVar4,parts,__size);
    qsort(plVar4,l,8,compare_ints);
    if (*plVar4 == 0) {
      bVar10 = 1 < l;
      if (bVar10) {
        if (((int)plVar4[1] - (int)*plVar4 & 0xfffffffeU) == 0) {
          uVar7 = 1;
          do {
            if ((2 - l) + uVar7 == 1) goto LAB_0010980f;
            lVar5 = uVar7 + 1;
            plVar1 = plVar4 + uVar7;
            uVar7 = uVar7 + 1;
          } while (((int)plVar4[lVar5] - (int)*plVar1 & 0xfffffffeU) == 0);
          bVar10 = uVar7 < l;
        }
        free(plVar4);
        if (err != (inform_error *)0x0) {
          *err = INFORM_EPARTS;
        }
        if (bVar10) {
          return (int *)0x0;
        }
      }
LAB_0010980f:
      lVar5 = plVar4[l - 1];
      free(plVar4);
      if (lVar5 + 1U != nparts) {
        if (err == (inform_error *)0x0) {
          return (int *)0x0;
        }
        *err = INFORM_EPARTS;
        return (int *)0x0;
      }
      __ptr = box;
      if ((box != (int *)0x0) || (__ptr = (int *)malloc((n * 4 + 4) * nparts), __ptr != (int *)0x0))
      {
        lVar5 = nparts * n;
        if (nparts == l) {
          memcpy(__ptr,series,n * l * 4);
          if (l != 0) {
            sVar6 = 0;
            do {
              __ptr[lVar5 + sVar6] = b[sVar6];
              sVar6 = sVar6 + 1;
            } while (l != sVar6);
            return __ptr;
          }
          return __ptr;
        }
        plVar4 = (long *)malloc(__size);
        if (plVar4 != (long *)0x0) {
          if (l != 0) {
            memset(plVar4,0xff,__size);
          }
          bVar10 = nparts != 0;
          if (bVar10) {
            uVar7 = 0;
            do {
              if (l == 0) {
                sVar6 = 0;
              }
              else {
                sVar8 = 0;
                sVar6 = 0;
                do {
                  if (parts[sVar8] == uVar7) {
                    plVar4[sVar6] = sVar8;
                    sVar6 = sVar6 + 1;
                  }
                  sVar8 = sVar8 + 1;
                } while (l != sVar8);
              }
              if (sVar6 != 1) {
                b_00 = (int *)malloc((n * 4 + 4) * sVar6);
                if (b_00 == (int *)0x0) {
                  free(plVar4);
                  if (box == (int *)0x0) {
                    free(__ptr);
                  }
                  if (err != (inform_error *)0x0) {
                    *err = INFORM_ENOMEM;
                  }
                }
                else {
                  __ptr[lVar5 + uVar7] = 1;
                  if (sVar6 != 0) {
                    iVar9 = __ptr[lVar5 + uVar7];
                    sVar8 = 0;
                    __dest = b_00 + sVar6;
                    do {
                      lVar2 = plVar4[sVar8];
                      iVar9 = iVar9 * b[lVar2];
                      b_00[sVar8] = b[lVar2];
                      __ptr[lVar5 + uVar7] = iVar9;
                      if (n != 0) {
                        memcpy(__dest,series + lVar2 * n,n * 4);
                      }
                      sVar8 = sVar8 + 1;
                      __dest = __dest + n;
                    } while (sVar6 != sVar8);
                  }
                  inform_black_box(b_00 + sVar6,sVar6,1,n,b_00,(size_t *)0x0,(size_t *)0x0,
                                   __ptr + uVar7 * n,err);
                  free(b_00);
                  _Var3 = inform_failed(err);
                  if (!_Var3) goto LAB_00109ab5;
                  free(plVar4);
                  if (box == (int *)0x0) {
                    free(__ptr);
                  }
                }
                if (bVar10) {
                  return (int *)0x0;
                }
                break;
              }
              lVar2 = *plVar4;
              memcpy(__ptr + uVar7 * n,series + lVar2 * n,n * 4);
              __ptr[lVar5 + uVar7] = b[lVar2];
LAB_00109ab5:
              if (l != 0) {
                memset(plVar4,0xff,__size);
              }
              uVar7 = uVar7 + 1;
              bVar10 = uVar7 < nparts;
            } while (uVar7 != nparts);
          }
          free(plVar4);
          return __ptr;
        }
        if (box == (int *)0x0) {
          free(__ptr);
        }
      }
      if (err == (inform_error *)0x0) {
        return (int *)0x0;
      }
      *err = INFORM_ENOMEM;
      return (int *)0x0;
    }
    free(plVar4);
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_EPARTS;
  }
  return (int *)0x0;
}

Assistant:

int *inform_black_box_parts(int const *series, size_t l, size_t n, int const *b,
    size_t const *parts, size_t nparts, int *box, inform_error *err)
{
    if (check_arguments(series, l, 1, n, b, NULL, NULL, err))
    {
        return NULL;
    }
    if (parts == NULL || nparts < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
    }
    else
    {
        size_t *sorted_parts = malloc(l * sizeof(size_t));
        memcpy(sorted_parts, parts, l * sizeof(size_t));
        qsort(sorted_parts, l, sizeof(size_t), compare_ints);
        if (sorted_parts[0] != 0)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        for (size_t i = 1; i < l; ++i)
        {
            int x = (int)(sorted_parts[i] - sorted_parts[i-1]);
            if (x != 0 && x != 1)
            {
                free(sorted_parts);
                INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
            }
        }
        if (sorted_parts[l-1] + 1 != nparts)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        free(sorted_parts);
    }

    int allocate = (box == NULL);
    if (allocate)
    {
        box = malloc(nparts * (1 + n) * sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    int *partitioned = box;
    int *bases = partitioned + nparts * n;
    if (nparts == l)
    {
        memcpy(partitioned, series, l * n * sizeof(int));
        for (size_t i = 0; i < l; ++i) bases[i] = b[i];
    }
    else
    {
        size_t *members = malloc(l * sizeof(size_t));
        if (members == NULL)
        {
            if (allocate) free(box);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) members[i] = -1;

        for (size_t i = 0; i < nparts; ++i)
        {
            size_t k = 0;
            for (size_t j = 0; j < l; ++j)
            {
                if (parts[j] == i)
                {
                    members[k++] = j;
                }
            }

            if (k == 1)
            {
                memcpy(partitioned + n*i, series + n*members[0], n*sizeof(int));
                bases[i] = b[members[0]];
            }
            else
            {
                int *subbases = malloc(k * (1 + n) * sizeof(int));
                int *subseries = subbases + k;
                if (subseries == NULL)
                {
                    free(members);
                    if (allocate) free(box);
                    INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                }
                bases[i] = 1;
                for (size_t j = 0; j < k; ++j)
                {
                    subbases[j] = b[members[j]];
                    bases[i] *= subbases[j];
                    for (size_t p = 0; p < n; ++p)
                    {
                        subseries[p + n*j] = series[p + n*members[j]];
                    }
                }
                inform_black_box(subseries, k, 1, n, subbases, NULL, NULL,
                    partitioned + n*i, err);
                free(subbases);
                if (inform_failed(err))
                {
                    free(members);
                    if (allocate) free(box);
                    return NULL;
                }
            }
            for (size_t i = 0; i < l; ++i) members[i] = -1;
        }
        free(members);
    }
    return box;
}